

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::FloatBitsToUintIntCase::compare
          (FloatBitsToUintIntCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  ostringstream *this_00;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  Hex<8UL> local_38;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  bVar10 = true;
  if (0 < (int)uVar4) {
    uVar8 = **inputs;
    uVar6 = **outputs - uVar8;
    uVar3 = -uVar6;
    if (0 < (int)uVar6) {
      uVar3 = uVar6;
    }
    uVar6 = ~(-1 << (0x17 - (&DAT_0096a1bc)[(ulong)PVar1 * 4] & 0x1f));
    uVar9 = 0;
    bVar10 = false;
    if ((int)uVar3 <= (int)uVar6) {
      uVar9 = 0;
      do {
        if ((ulong)uVar4 - 1 == uVar9) {
          return true;
        }
        uVar8 = *(uint *)((long)*inputs + (uVar9 + 1) * 4);
        uVar7 = *(int *)((long)*outputs + (uVar9 + 1) * 4) - uVar8;
        uVar3 = -uVar7;
        if (0 < (int)uVar7) {
          uVar3 = uVar7;
        }
        uVar9 = uVar9 + 1;
      } while ((int)uVar3 <= (int)uVar6);
      bVar10 = uVar4 <= uVar9;
    }
    this_00 = &(this->super_CommonFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
    poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)uVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
    local_38.value = (deUint64)uVar8;
    poVar5 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," with threshold ",0x10);
    local_38.value = (deUint64)uVar6;
    poVar5 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got diff ",0xb);
    local_38.value = (ulong)uVar3;
    tcu::Format::Hex<8UL>::toStream(&local_38,poVar5);
  }
  return bVar10;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const int				maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const deUint32	out0		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	refOut0		= tcu::Float32(in0).bits();
			const int		ulpDiff		= de::abs((int)out0 - (int)refOut0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(refOut0) << " with threshold "
							<< tcu::toHex(maxUlpDiff) << ", got diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}